

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent *indent)

{
  pointer pbVar1;
  cmTest *pcVar2;
  char cVar3;
  ostream *poVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  char *pcVar7;
  pointer pbVar8;
  allocator aStack_a1;
  cmTestGenerator *pcStack_a0;
  Indent *pIStack_98;
  string sStack_90;
  string sStack_70;
  string sStack_50;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
    return;
  }
  this->TestGenerated = true;
  pcVar2 = this->Test;
  pcStack_a0 = this;
  pIStack_98 = indent;
  std::__cxx11::string::string
            ((string *)&sStack_70,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_70);
  cmScriptGeneratorIndent::Write(pIStack_98,os);
  std::operator<<(os,"add_test(");
  std::__cxx11::string::string((string *)&sStack_90,(string *)&pcStack_a0->Test->Name);
  poVar4 = std::operator<<(os,(string *)&sStack_90);
  poVar4 = std::operator<<(poVar4," \"");
  poVar4 = std::operator<<(poVar4,(string *)&sStack_70);
  std::operator<<(poVar4,"\"");
  std::__cxx11::string::~string((string *)&sStack_90);
  pbVar8 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar1 = pbVar8 + 1,
        pbVar1 != (pcVar2->Command).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(os," \"");
    pcVar5 = pbVar8[1]._M_dataplus._M_p;
    for (pcVar7 = pcVar5; pcVar7 != pcVar5 + pbVar8[1]._M_string_length; pcVar7 = pcVar7 + 1) {
      cVar3 = *pcVar7;
      if (cVar3 == '\"') {
        std::operator<<(os,'\\');
        cVar3 = *pcVar7;
      }
      std::operator<<(os,cVar3);
      pcVar5 = (pbVar1->_M_dataplus)._M_p;
    }
    std::operator<<(os,"\"");
    pbVar8 = pbVar1;
  }
  poVar4 = std::operator<<(os,")");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar2 = pcStack_a0->Test;
  if ((pcVar2->Properties).
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmScriptGeneratorIndent::Write(pIStack_98,os);
    poVar4 = std::operator<<(os,"set_tests_properties(");
    std::__cxx11::string::string((string *)&sStack_90,(string *)&pcStack_a0->Test->Name);
    poVar4 = std::operator<<(poVar4,(string *)&sStack_90);
    std::operator<<(poVar4," PROPERTIES ");
    std::__cxx11::string::~string((string *)&sStack_90);
    for (p_Var6 = (pcVar2->Properties).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(pcVar2->Properties).
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      poVar4 = std::operator<<(os," ");
      poVar4 = std::operator<<(poVar4,(string *)(p_Var6 + 1));
      poVar4 = std::operator<<(poVar4," ");
      pcVar5 = cmProperty::GetValue((cmProperty *)(p_Var6 + 2));
      std::__cxx11::string::string((string *)&sStack_50,pcVar5,&aStack_a1);
      cmOutputConverter::EscapeForCMake(&sStack_90,&sStack_50);
      std::operator<<(poVar4,(string *)&sStack_90);
      std::__cxx11::string::~string((string *)&sStack_90);
      std::__cxx11::string::~string((string *)&sStack_50);
    }
    poVar4 = std::operator<<(os,")");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&sStack_70);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os,
                                            Indent const& indent)
{
  if(this->ActionsPerConfig)
    {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
    }
  else
    {
    // This is an old-style test, so there is only one config.
    //assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
    }
}